

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview_p.h
# Opt level: O2

bool __thiscall QTreeViewPrivate::isIndexExpanded(QTreeViewPrivate *this,QModelIndex *idx)

{
  bool bVar1;
  ItemFlags IVar2;
  long in_FS_OFFSET;
  QPersistentModelIndex QStack_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  IVar2 = QModelIndex::flags(idx);
  if (-1 < (char)IVar2.super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.
                 i) {
    bVar1 = QAbstractItemViewPrivate::isPersistent(&this->super_QAbstractItemViewPrivate,idx);
    if (bVar1) {
      QPersistentModelIndex::QPersistentModelIndex(&QStack_28,idx);
      bVar1 = QHash<QPersistentModelIndex,_QHashDummyValue>::contains
                        (&(this->expandedIndexes).q_hash,&QStack_28);
      QPersistentModelIndex::~QPersistentModelIndex(&QStack_28);
      goto LAB_005497a6;
    }
  }
  bVar1 = false;
LAB_005497a6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

inline bool isIndexExpanded(const QModelIndex &idx) const {
        //We first check if the idx is a QPersistentModelIndex, because creating QPersistentModelIndex is slow
        return !(idx.flags() & Qt::ItemNeverHasChildren) && isPersistent(idx) && expandedIndexes.contains(idx);
    }